

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  uint uVar2;
  MemPage *pMVar3;
  BtShared *pBVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Pgno *pPVar8;
  undefined8 uVar9;
  size_t sVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  u8 *puVar16;
  uchar *puVar17;
  uint uVar18;
  ulong uVar19;
  uchar *puVar20;
  u32 uVar21;
  int iVar22;
  long lVar23;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_6c;
  ulong local_68;
  uchar *local_60;
  int local_54;
  BtShared *local_50;
  size_t local_48;
  u8 *local_40;
  PgHdr *local_38;
  
  pMVar3 = pCur->pPage;
  if (pMVar3->nCell <= pCur->ix) {
    uVar9 = 0x11886;
    goto LAB_001332d4;
  }
  uVar12 = (ulong)amt;
  pBVar4 = pCur->pBt;
  local_60 = pBuf;
  getCellInfo(pCur);
  puVar16 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar6 = (uint)uVar1;
  local_50 = pBVar4;
  if ((ulong)(pBVar4->usableSize - uVar6) < (ulong)((long)puVar16 - (long)pMVar3->aData)) {
    uVar9 = 0x11895;
    goto LAB_001332d4;
  }
  local_54 = eOp;
  if (uVar6 < offset || uVar6 - offset == 0) {
    uVar19 = (ulong)(offset - uVar1);
    iVar7 = 0;
  }
  else {
    uVar21 = uVar6 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar21 = amt;
    }
    puVar15 = puVar16 + offset;
    puVar17 = local_60;
    local_68 = uVar12;
    local_40 = puVar16;
    if ((eOp == 0) ||
       (iVar7 = sqlite3PagerWrite(pMVar3->pDbPage), puVar15 = local_60, puVar17 = puVar16 + offset,
       iVar7 == 0)) {
      puVar20 = local_60;
      memcpy(puVar17,puVar15,(long)(int)uVar21);
      iVar7 = 0;
      local_60 = puVar20;
    }
    local_60 = local_60 + (int)uVar21;
    uVar12 = (ulong)((int)local_68 - uVar21);
    uVar19 = 0;
    puVar16 = local_40;
  }
  iVar11 = (int)uVar12;
  if ((iVar7 == 0) && (iVar11 != 0)) {
    uVar6 = local_50->usableSize - 4;
    uVar14 = (ulong)uVar6;
    uVar1 = (pCur->info).nLocal;
    uVar13 = *(uint *)(puVar16 + uVar1);
    uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    local_68 = CONCAT44(local_68._4_4_,uVar6);
    local_6c = uVar13;
    if ((pCur->curFlags & 4) == 0) {
      pPVar8 = (Pgno *)0x0;
      uVar6 = (((local_50->usableSize - (uint)uVar1) + (pCur->info).nPayload) - 5) / uVar6;
      if (pCur->aOverflow == (Pgno *)0x0) {
LAB_001333df:
        pPVar8 = (Pgno *)sqlite3Realloc(pPVar8,(long)(int)(uVar6 * 2) << 2);
        if (pPVar8 == (Pgno *)0x0) {
          return 7;
        }
        pCur->aOverflow = pPVar8;
      }
      else {
        iVar7 = (*sqlite3Config.m.xSize)(pCur->aOverflow);
        pPVar8 = pCur->aOverflow;
        if (iVar7 < (int)(uVar6 * 4)) goto LAB_001333df;
      }
      lVar23 = 0;
      memset(pPVar8,0,(long)(int)uVar6 << 2);
      pCur->curFlags = pCur->curFlags | 4;
      uVar14 = local_68 & 0xffffffff;
    }
    else {
      uVar5 = uVar19 / uVar6;
      lVar23 = 0;
      if (pCur->aOverflow[uVar5] != 0) {
        lVar23 = (long)(int)uVar5;
        uVar13 = pCur->aOverflow[lVar23];
        uVar19 = uVar19 % (ulong)uVar6;
        local_6c = uVar13;
      }
    }
    if (uVar13 != 0) {
      local_40 = (u8 *)CONCAT44(local_40._4_4_,(uint)(local_54 == 0) * 2);
      lVar23 = lVar23 * 4;
      do {
        iVar11 = (int)uVar12;
        if (local_50->nPage < uVar13) {
          uVar9 = 0x118d3;
          goto LAB_001332d4;
        }
        pPVar8 = pCur->aOverflow;
        *(uint *)((long)pPVar8 + lVar23) = uVar13;
        uVar18 = (uint)uVar19;
        uVar6 = (uint)uVar14;
        if (uVar18 < uVar6) {
          iVar22 = uVar6 - uVar18;
          if (iVar11 + uVar18 <= uVar6) {
            iVar22 = iVar11;
          }
          iVar7 = (*local_50->pPager->xGet)(local_50->pPager,uVar13,&local_38,(int)local_40);
          sVar10 = (size_t)iVar22;
          if (iVar7 == 0) {
            puVar20 = (uchar *)((ulong)(uVar18 + 4) + (long)local_38->pData);
            uVar6 = *local_38->pData;
            local_6c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                       uVar6 << 0x18;
            puVar15 = puVar20;
            puVar17 = local_60;
            local_48 = sVar10;
            if ((local_54 == 0) ||
               (iVar7 = sqlite3PagerWrite(local_38), puVar15 = local_60, puVar17 = puVar20,
               iVar7 == 0)) {
              memcpy(puVar17,puVar15,local_48);
              iVar7 = 0;
            }
            uVar19 = 0;
            if (local_38 != (DbPage *)0x0) {
              sqlite3PagerUnrefNotNull(local_38);
            }
            sVar10 = local_48;
          }
          else {
          }
          uVar14 = (ulong)(uint)local_68;
          uVar12 = (ulong)(uint)(iVar11 - iVar22);
          if (iVar11 - iVar22 == 0) {
            return iVar7;
          }
          local_60 = local_60 + sVar10;
        }
        else {
          uVar2 = *(uint *)((long)pPVar8 + lVar23 + 4);
          if (uVar2 == 0) {
            iVar7 = getOverflowPage(local_50,uVar13,(MemPage **)0x0,&local_6c);
            uVar14 = local_68 & 0xffffffff;
          }
          else {
            iVar7 = 0;
            local_6c = uVar2;
          }
          uVar19 = (ulong)(uVar18 - uVar6);
        }
        iVar11 = (int)uVar12;
        if (iVar7 != 0) goto LAB_00133571;
        uVar13 = local_6c;
        lVar23 = lVar23 + 4;
      } while (local_6c != 0);
    }
    iVar7 = 0;
  }
LAB_00133571:
  if (iVar7 != 0) {
    return iVar7;
  }
  if (iVar11 == 0) {
    return 0;
  }
  uVar9 = 0x11928;
LAB_001332d4:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          if( rc && nextPage>pBt->nPage ) rc = SQLITE_CORRUPT_BKPT;
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}